

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestCase * __thiscall
testing::internal::UnitTestImpl::GetTestCase
          (UnitTestImpl *this,char *test_case_name,char *type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *pvVar1;
  bool bVar2;
  byte bVar3;
  reference ppTVar4;
  const_iterator __position;
  value_type_conflict1 *__x;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *in_RSI;
  long in_RDI;
  TestCase *new_test_case;
  const_reverse_iterator test_case;
  string *in_stack_fffffffffffffea8;
  TestCaseNameIs *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
  *in_stack_fffffffffffffec0;
  TearDownTestCaseFunc in_stack_ffffffffffffff20;
  TestCaseNameIs *in_stack_ffffffffffffff28;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
  *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
  *in_stack_ffffffffffffff38;
  TestCase *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [120];
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *local_18;
  TestCase *local_8;
  
  local_18 = in_RSI;
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::rbegin
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::rend
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  pvVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)pvVar1,&local_91);
  TestCaseNameIs::TestCaseNameIs(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>>,testing::internal::TestCaseNameIs>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
              *)in_stack_fffffffffffffeb0,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
              *)in_stack_fffffffffffffea8);
  TestCaseNameIs::~TestCaseNameIs((TestCaseNameIs *)0x178371);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::rend
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  bVar2 = std::operator!=(in_stack_fffffffffffffec0,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  if (bVar2) {
    ppTVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
                           *)in_stack_fffffffffffffeb0);
    local_8 = *ppTVar4;
  }
  else {
    __position._M_current = (TestCase **)operator_new(0xf8);
    TestCase::TestCase(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                       (char *)in_stack_ffffffffffffff30,
                       (SetUpTestCaseFunc)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff28,(char *)local_18,
               (allocator *)&stack0xffffffffffffff27);
    bVar3 = UnitTestOptions::MatchesFilter
                      ((string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       (char *)in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
    if ((bVar3 & 1) == 0) {
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::push_back
                (local_18,(value_type *)CONCAT17(bVar3,in_stack_fffffffffffffeb8));
    }
    else {
      *(int *)(in_RDI + 0x104) = *(int *)(in_RDI + 0x104) + 1;
      in_stack_fffffffffffffeb0 = (TestCaseNameIs *)(in_RDI + 0xb8);
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::begin
                ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                 in_stack_fffffffffffffea8);
      __gnu_cxx::
      __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
      ::operator+((__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                   *)CONCAT17(bVar3,in_stack_fffffffffffffeb8),
                  (difference_type)in_stack_fffffffffffffeb0);
      __gnu_cxx::
      __normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
      ::__normal_iterator<testing::TestCase**>
                ((__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                  *)in_stack_fffffffffffffeb0,
                 (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                  *)in_stack_fffffffffffffea8);
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::insert
                ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                 in_stack_ffffffffffffff40,__position,(value_type *)in_stack_ffffffffffffff38);
    }
    __x = (value_type_conflict1 *)(in_RDI + 0xd0);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,__x);
    local_8 = (TestCase *)__position._M_current;
  }
  return local_8;
}

Assistant:

TestCase* UnitTestImpl::GetTestCase(const char* test_case_name,
                                    const char* type_param,
                                    Test::SetUpTestCaseFunc set_up_tc,
                                    Test::TearDownTestCaseFunc tear_down_tc) {
  // Can we find a TestCase with the given name?
  const std::vector<TestCase*>::const_reverse_iterator test_case =
      std::find_if(test_cases_.rbegin(), test_cases_.rend(),
                   TestCaseNameIs(test_case_name));

  if (test_case != test_cases_.rend())
    return *test_case;

  // No.  Let's create one.
  TestCase* const new_test_case =
      new TestCase(test_case_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test case?
  if (internal::UnitTestOptions::MatchesFilter(test_case_name,
                                               kDeathTestCaseFilter)) {
    // Yes.  Inserts the test case after the last death test case
    // defined so far.  This only works when the test cases haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_case_;
    test_cases_.insert(test_cases_.begin() + last_death_test_case_,
                       new_test_case);
  } else {
    // No.  Appends to the end of the list.
    test_cases_.push_back(new_test_case);
  }

  test_case_indices_.push_back(static_cast<int>(test_case_indices_.size()));
  return new_test_case;
}